

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

int mg_value_equal(mg_value *lhs,mg_value *rhs)

{
  mg_value **ppmVar1;
  mg_value **ppmVar2;
  mg_point_3d *pmVar3;
  mg_point_3d *pmVar4;
  mg_relationship *pmVar5;
  mg_relationship *pmVar6;
  mg_point_2d *pmVar7;
  mg_point_2d *pmVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar11 = 0;
  if (lhs->type != rhs->type) {
    return 0;
  }
  switch(lhs->type) {
  case MG_VALUE_TYPE_NULL:
    return 1;
  case MG_VALUE_TYPE_BOOL:
    return (uint)(((rhs->field_1).bool_v != 0) != ((lhs->field_1).bool_v == 0));
  case MG_VALUE_TYPE_INTEGER:
  case MG_VALUE_TYPE_FLOAT:
    bVar14 = (lhs->field_1).integer_v == (rhs->field_1).integer_v;
    break;
  case MG_VALUE_TYPE_STRING:
    uVar11 = ((lhs->field_1).string_v)->size;
    if (uVar11 != ((rhs->field_1).string_v)->size) {
      return 0;
    }
    iVar10 = bcmp(((lhs->field_1).string_v)->data,((rhs->field_1).string_v)->data,(ulong)uVar11);
    bVar14 = iVar10 == 0;
    break;
  case MG_VALUE_TYPE_LIST:
    uVar11 = ((lhs->field_1).list_v)->size;
    uVar13 = (ulong)uVar11;
    if (uVar11 != ((rhs->field_1).list_v)->size) {
      return 0;
    }
    bVar14 = uVar13 == 0;
    if (!bVar14) {
      ppmVar1 = ((lhs->field_1).list_v)->elements;
      ppmVar2 = ((rhs->field_1).list_v)->elements;
      iVar10 = mg_value_equal(*ppmVar1,*ppmVar2);
      if (iVar10 != 0) {
        uVar9 = 1;
        do {
          uVar12 = uVar9;
          if (uVar13 == uVar12) break;
          iVar10 = mg_value_equal(ppmVar1[uVar12],ppmVar2[uVar12]);
          uVar9 = uVar12 + 1;
        } while (iVar10 != 0);
        bVar14 = uVar13 <= uVar12;
      }
    }
    return (uint)bVar14;
  case MG_VALUE_TYPE_MAP:
    iVar10 = mg_map_equal((lhs->field_1).map_v,(rhs->field_1).map_v);
    return iVar10;
  case MG_VALUE_TYPE_NODE:
    iVar10 = mg_node_equal((lhs->field_1).node_v,(rhs->field_1).node_v);
    return iVar10;
  case MG_VALUE_TYPE_RELATIONSHIP:
    iVar10 = mg_relationship_equal((lhs->field_1).relationship_v,(rhs->field_1).relationship_v);
    return iVar10;
  case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
    iVar10 = mg_unbound_relationship_equal
                       ((lhs->field_1).unbound_relationship_v,(rhs->field_1).unbound_relationship_v)
    ;
    return iVar10;
  case MG_VALUE_TYPE_PATH:
    iVar10 = mg_path_equal((lhs->field_1).path_v,(rhs->field_1).path_v);
    return iVar10;
  case MG_VALUE_TYPE_DATE:
  case MG_VALUE_TYPE_LOCAL_TIME:
    bVar14 = ((lhs->field_1).node_v)->id == ((rhs->field_1).node_v)->id;
    break;
  case MG_VALUE_TYPE_TIME:
  case MG_VALUE_TYPE_LOCAL_DATE_TIME:
    if (((lhs->field_1).relationship_v)->id != ((rhs->field_1).relationship_v)->id) {
      return 0;
    }
    bVar14 = ((lhs->field_1).relationship_v)->start_id == ((rhs->field_1).relationship_v)->start_id;
    break;
  case MG_VALUE_TYPE_DATE_TIME:
  case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
    pmVar5 = (lhs->field_1).relationship_v;
    pmVar6 = (rhs->field_1).relationship_v;
    if (pmVar5->id != pmVar6->id) {
      return 0;
    }
    if (pmVar5->start_id != pmVar6->start_id) {
      return 0;
    }
    bVar14 = pmVar5->end_id == pmVar6->end_id;
    break;
  case MG_VALUE_TYPE_DURATION:
    pmVar5 = (lhs->field_1).relationship_v;
    pmVar6 = (rhs->field_1).relationship_v;
    if (pmVar5->start_id != pmVar6->start_id) {
      return 0;
    }
    if (pmVar5->id != pmVar6->id) {
      return 0;
    }
    if (pmVar5->end_id != pmVar6->end_id) {
      return 0;
    }
    bVar14 = pmVar5->type == pmVar6->type;
    break;
  case MG_VALUE_TYPE_POINT_2D:
    pmVar7 = (lhs->field_1).point_2d_v;
    pmVar8 = (rhs->field_1).point_2d_v;
    if (pmVar7->srid != pmVar8->srid) {
      return 0;
    }
    if (pmVar7->x != pmVar8->x) {
      return 0;
    }
    if (NAN(pmVar7->x) || NAN(pmVar8->x)) {
      return 0;
    }
    bVar14 = pmVar8->y == pmVar7->y;
    goto LAB_0010b658;
  case MG_VALUE_TYPE_POINT_3D:
    pmVar3 = (lhs->field_1).point_3d_v;
    pmVar4 = (rhs->field_1).point_3d_v;
    if (pmVar3->srid != pmVar4->srid) {
      return 0;
    }
    if (pmVar3->x != pmVar4->x) {
      return 0;
    }
    if (NAN(pmVar3->x) || NAN(pmVar4->x)) {
      return 0;
    }
    if (pmVar3->y != pmVar4->y) {
      return 0;
    }
    if (NAN(pmVar3->y) || NAN(pmVar4->y)) {
      return 0;
    }
    bVar14 = pmVar4->z == pmVar3->z;
LAB_0010b658:
    uVar11 = -(uint)bVar14 & 1;
  default:
    goto switchD_0010b417_caseD_14;
  }
  uVar11 = (uint)bVar14;
switchD_0010b417_caseD_14:
  return uVar11;
}

Assistant:

int mg_value_equal(const mg_value *lhs, const mg_value *rhs) {
  if (lhs->type != rhs->type) {
    return 0;
  }
  switch (lhs->type) {
    case MG_VALUE_TYPE_NULL:
      return 1;

    case MG_VALUE_TYPE_BOOL:
      return (lhs->bool_v == 0) == (rhs->bool_v == 0);

    case MG_VALUE_TYPE_INTEGER:
      return lhs->integer_v == rhs->integer_v;

    case MG_VALUE_TYPE_FLOAT:
      return lhs->integer_v == rhs->integer_v;

    case MG_VALUE_TYPE_STRING:
      return mg_string_equal(lhs->string_v, rhs->string_v);
    case MG_VALUE_TYPE_LIST:
      if (lhs->list_v->size != rhs->list_v->size) {
        return 0;
      }
      for (uint32_t i = 0; i < lhs->list_v->size; ++i) {
        if (!mg_value_equal(lhs->list_v->elements[i], rhs->list_v->elements[i]))
          return 0;
      }
      return 1;
    case MG_VALUE_TYPE_MAP:
      return mg_map_equal(lhs->map_v, rhs->map_v);
    case MG_VALUE_TYPE_NODE:
      return mg_node_equal(lhs->node_v, rhs->node_v);
    case MG_VALUE_TYPE_RELATIONSHIP:
      return mg_relationship_equal(lhs->relationship_v, rhs->relationship_v);
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      return mg_unbound_relationship_equal(lhs->unbound_relationship_v,
                                           rhs->unbound_relationship_v);
    case MG_VALUE_TYPE_PATH:
      return mg_path_equal(lhs->path_v, rhs->path_v);
    case MG_VALUE_TYPE_DATE:
      return mg_date_equal(lhs->date_v, rhs->date_v);
    case MG_VALUE_TYPE_TIME:
      return mg_time_equal(lhs->time_v, rhs->time_v);
    case MG_VALUE_TYPE_LOCAL_TIME:
      return mg_local_time_equal(lhs->local_time_v, rhs->local_time_v);
    case MG_VALUE_TYPE_DATE_TIME:
      return mg_date_time_equal(lhs->date_time_v, rhs->date_time_v);
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      return mg_date_time_zone_id_equal(lhs->date_time_zone_id_v,
                                        rhs->date_time_zone_id_v);
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      return mg_local_date_time_equal(lhs->local_date_time_v,
                                      rhs->local_date_time_v);
    case MG_VALUE_TYPE_DURATION:
      return mg_duration_equal(lhs->duration_v, rhs->duration_v);
    case MG_VALUE_TYPE_POINT_2D:
      return mg_point_2d_equal(lhs->point_2d_v, rhs->point_2d_v);
    case MG_VALUE_TYPE_POINT_3D:
      return mg_point_3d_equal(lhs->point_3d_v, rhs->point_3d_v);
    case MG_VALUE_TYPE_UNKNOWN:
      return 0;
  }
  return 0;
}